

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

uint DecodeLatin0(uint c)

{
  uint local_c;
  uint c_local;
  
  local_c = c;
  if ((0xa3 < c) && (c < 0xbf)) {
    switch(c) {
    case 0xa4:
      local_c = 0x20ac;
      break;
    case 0xa6:
      local_c = 0x160;
      break;
    case 0xa8:
      local_c = 0x161;
      break;
    case 0xb4:
      local_c = 0x17d;
      break;
    case 0xb8:
      local_c = 0x17e;
      break;
    case 0xbc:
      local_c = 0x152;
      break;
    case 0xbd:
      local_c = 0x153;
      break;
    case 0xbe:
      local_c = 0x178;
    }
  }
  return local_c;
}

Assistant:

static uint DecodeLatin0(uint c)
{
    if (163 < c && c < 191)
    {
        switch (c)
        {
        case 0xA4: c = 0x20AC; break;
        case 0xA6: c = 0x0160; break;
        case 0xA8: c = 0x0161; break;
        case 0xB4: c = 0x017D; break;
        case 0xB8: c = 0x017E; break;
        case 0xBC: c = 0x0152; break;
        case 0xBD: c = 0x0153; break;
        case 0xBE: c = 0x0178; break;
        }
    }
    return c;
}